

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonReturnJson(JsonNode *pNode,sqlite3_context *pCtx,sqlite3_value **aReplace)

{
  byte *pbVar1;
  Mem *pMVar2;
  JsonString local_98;
  
  local_98.zBuf = local_98.zSpace;
  local_98.nAlloc = 100;
  local_98.nUsed = 0;
  local_98.bStatic = '\x01';
  local_98.bErr = '\0';
  local_98.pCtx = pCtx;
  jsonRenderNode(pNode,&local_98,aReplace);
  if (local_98.bErr == '\0') {
    sqlite3_result_text64
              (local_98.pCtx,local_98.zBuf,local_98.nUsed,
               (_func_void_void_ptr *)(-(ulong)(local_98.bStatic != '\0') | (ulong)sqlite3_free),
               '\x01');
  }
  pMVar2 = pCtx->pOut;
  pMVar2->eSubtype = 'J';
  pbVar1 = (byte *)((long)&pMVar2->flags + 1);
  *pbVar1 = *pbVar1 | 8;
  return;
}

Assistant:

static void jsonReturnJson(
  JsonNode *pNode,            /* Node to return */
  sqlite3_context *pCtx,      /* Return value for this function */
  sqlite3_value **aReplace    /* Array of replacement values */
){
  JsonString s;
  jsonInit(&s, pCtx);
  jsonRenderNode(pNode, &s, aReplace);
  jsonResult(&s);
  sqlite3_result_subtype(pCtx, JSON_SUBTYPE);
}